

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void sorter_merge_sort_in_place(int64_t *dst,size_t len)

{
  int64_t *piVar1;
  size_t len_00;
  long lVar2;
  int64_t _sort_swap_temp;
  size_t sVar3;
  ulong r;
  int64_t *piVar4;
  size_t sVar5;
  ulong len_01;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  piVar1 = dst + -1;
  do {
    sVar3 = rbnd(len);
    if (len < 2) {
      return;
    }
    if (len < 0x11) {
      sorter_bitonic_sort(dst,len);
      return;
    }
    uVar6 = (len / sVar3 - 1) * sVar3;
    piVar4 = piVar1;
    for (uVar9 = 2; uVar9 <= uVar6; uVar9 = uVar9 + 2) {
      lVar2 = piVar4[2];
      if (lVar2 < piVar4[1]) {
        piVar4[2] = piVar4[1];
        piVar4[1] = lVar2;
      }
      piVar4 = piVar4 + 2;
      if ((uVar9 & 2) == 0) {
        uVar7 = len - uVar9;
        len_01 = 2;
LAB_00103d8e:
        if ((len_01 & uVar9) == 0) {
          if (*(long *)((long)piVar4 + ((long)-(len_01 << 0x20) >> 0x1d)) <= piVar4[1 - len_01])
          goto code_r0x00103db5;
          uVar8 = len_01;
          if (len_01 < uVar7) {
            sorter_merge_sort_in_place_aswap(dst + (uVar9 - len_01),dst + (len - len_01),len_01);
            while ((len_01 = uVar8 * 2, len_01 < uVar7 || len_01 - uVar7 == 0 &&
                   ((len_01 & uVar9) == 0))) {
              sorter_merge_sort_in_place_frontmerge
                        (dst + uVar9 + uVar8 * -2,uVar8,dst + (len - uVar8),uVar8);
              uVar8 = len_01;
            }
            sorter_merge_sort_in_place_backmerge(piVar1 + len,uVar8,piVar4 + -uVar8,uVar8);
            uVar8 = len_01;
          }
          do {
            r = uVar8;
            uVar8 = r >> 1;
          } while (uVar7 < r);
          while ((len_01 & uVar9) == 0) {
            sorter_merge_sort_in_place_rmerge
                      (dst + uVar9 + len_01 * -2,len_01 * 2,len_01 & 0x7ffffffffffffffe,r);
            len_01 = len_01 * 2;
          }
        }
      }
    }
    sVar5 = 0;
    for (uVar9 = sVar3; uVar9 < uVar6; uVar9 = uVar9 * 2) {
      if (((uVar9 & uVar6) != 0) &&
         (len_00 = sVar5 + uVar9, bVar10 = sVar5 != 0, sVar5 = len_00, bVar10)) {
        sorter_merge_sort_in_place_rmerge(dst + (uVar6 - len_00),len_00,uVar9,sVar3);
      }
    }
    sVar5 = len - uVar6;
    sorter_merge_sort_in_place(dst + uVar6,sVar5);
    sorter_merge_sort_in_place_aswap(dst,dst + uVar6,sVar5);
    sVar3 = sorter_merge_sort_in_place_backmerge
                      (piVar1 + sVar5,sVar5,dst + (uVar6 - 1),uVar6 - sVar5);
    len = sVar5 + sVar3;
  } while( true );
code_r0x00103db5:
  len_01 = len_01 * 2;
  goto LAB_00103d8e;
}

Assistant:

void MERGE_SORT_IN_PLACE(SORT_TYPE *dst, const size_t len) {
  /* don't bother sorting an array of size <= 1 */
  size_t r = rbnd(len);
  size_t lr = (len / r - 1) * r;
  SORT_TYPE *dst1 = dst - 1;
  size_t p, m, q, q1, p0;

  if (len <= 1) {
    return;
  }

  if (len <= SMALL_SORT_BND) {
    SMALL_SORT(dst, len);
    return;
  }

  for (p = 2; p <= lr; p += 2) {
    dst1 += 2;

    if (SORT_CMP(dst1[0], dst1[-1]) < 0) {
      SORT_SWAP(dst1[0], dst1[-1]);
    }

    if (p & 2) {
      continue;
    }

    m = len - p;
    q = 2;

    while ((p & q) == 0) {
      if (SORT_CMP(dst1[1 - q], dst1[-(int)q]) < 0) {
        break;
      }

      q *= 2;
    }

    if (p & q) {
      continue;
    }

    if (q < m) {
      p0 = len - q;
      MERGE_SORT_IN_PLACE_ASWAP(dst + p - q, dst + p0, q);

      for (;;) {
        q1 = 2 * q;

        if ((q1 > m) || (p & q1)) {
          break;
        }

        p0 = len - q1;
        MERGE_SORT_IN_PLACE_FRONTMERGE(dst + (p - q1), q, dst + p0 + q, q);
        q = q1;
      }

      MERGE_SORT_IN_PLACE_BACKMERGE(dst + (len - 1), q, dst1 - q, q);
      q *= 2;
    }

    q1 = q;

    while (q1 > m) {
      q1 /= 2;
    }

    while ((q & p) == 0) {
      q *= 2;
      MERGE_SORT_IN_PLACE_RMERGE(dst + (p - q), q, q / 2, q1);
    }
  }

  q1 = 0;

  for (q = r; q < lr; q *= 2) {
    if ((lr & q) != 0) {
      q1 += q;

      if (q1 != q) {
        MERGE_SORT_IN_PLACE_RMERGE(dst + (lr - q1), q1, q, r);
      }
    }
  }

  m = len - lr;
  MERGE_SORT_IN_PLACE(dst + lr, m);
  MERGE_SORT_IN_PLACE_ASWAP(dst, dst + lr, m);
  m += MERGE_SORT_IN_PLACE_BACKMERGE(dst + (m - 1), m, dst + (lr - 1), lr - m);
  MERGE_SORT_IN_PLACE(dst, m);
}